

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_module.cpp
# Opt level: O2

void __thiscall sc_core::sc_module::sc_module(sc_module *this,string *s)

{
  sc_object::sc_object(&this->super_sc_object,(s->_M_dataplus)._M_p);
  (this->super_sc_object)._vptr_sc_object = (_func_int **)&PTR_print_00263de0;
  (this->super_sc_process_host)._vptr_sc_process_host = (_func_int **)&PTR__sc_module_00263e88;
  sc_sensitive::sc_sensitive(&this->sensitive,this);
  sc_sensitive_pos::sc_sensitive_pos(&this->sensitive_pos,this);
  sc_sensitive_neg::sc_sensitive_neg(&this->sensitive_neg,this);
  this->m_end_module_called = false;
  this->m_port_vec =
       (vector<sc_core::sc_port_base_*,_std::allocator<sc_core::sc_port_base_*>_> *)0x0;
  this->m_port_index = 0;
  this->m_name_gen = (sc_name_gen *)0x0;
  this->m_module_name_p = (sc_module_name *)0x0;
  sc_report_handler::report
            (SC_WARNING,
             "sc_module(const char*), sc_module(const std::string&) have been deprecated, use sc_module(const sc_module_name&)"
             ,(s->_M_dataplus)._M_p,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_module.cpp"
             ,0x107);
  sc_module_init(this);
  return;
}

Assistant:

sc_module::sc_module( const std::string& s )
: sc_object( s.c_str() ),
  sensitive(this),
  sensitive_pos(this),
  sensitive_neg(this),
  m_end_module_called(false),
  m_port_vec(),
  m_port_index(0),
  m_name_gen(0),
  m_module_name_p(0)
{
    SC_REPORT_WARNING( SC_ID_BAD_SC_MODULE_CONSTRUCTOR_, s.c_str() );
    sc_module_init();
}